

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sheet.hpp
# Opt level: O2

void __thiscall Excel::Sheet::initCell(Sheet *this,size_t row,size_t column)

{
  pointer pvVar1;
  iterator it;
  pointer this_00;
  ulong uVar2;
  
  this_00 = (this->m_cells).
            super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->m_cells).
                     super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)this_00) / 0x18) < row + 1)
  {
    std::
    vector<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
    ::resize(&this->m_cells,row + 1);
    this_00 = (this->m_cells).
              super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar2 = column + 1;
  if ((ulong)(((long)this_00[row].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)this_00[row].super__Vector_base<Excel::Cell,_std::allocator<Excel::Cell>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x70) < uVar2) {
    if (uVar2 <= this->m_columnsCount) {
      std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize
                ((this->m_cells).
                 super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,this->m_columnsCount);
      return;
    }
    this->m_columnsCount = uVar2;
    pvVar1 = (this->m_cells).
             super__Vector_base<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>,_std::allocator<std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (; this_00 != pvVar1; this_00 = this_00 + 1) {
      std::vector<Excel::Cell,_std::allocator<Excel::Cell>_>::resize(this_00,this->m_columnsCount);
    }
  }
  return;
}

Assistant:

inline void
Sheet::initCell( size_t row, size_t column )
{
	if( m_cells.size() < row + 1 )
		m_cells.resize( row + 1 );

	if( m_cells[ row ].size() < column + 1 )
	{
		bool all = false;

		if( column + 1 > m_columnsCount )
		{
			m_columnsCount = column + 1;
			all = true;
		}

		if( all )
		{
			for( std::vector< std::vector< Cell > >::iterator it = m_cells.begin(),
				last = m_cells.end(); it != last; ++it )
			{
				it->resize( m_columnsCount );
			}
		}
		else
			m_cells.back().resize( m_columnsCount );
	}
}